

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O0

void __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::_relax
          (WeightedDigraphSPDijkstra<int,_int> *this,WeightedDigraph<int,_int> *graph,
          SPElement *element)

{
  bool bVar1;
  int iVar2;
  SPElement local_b0;
  undefined1 local_a8 [16];
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *local_98;
  size_t i;
  size_t size;
  int local_70;
  int local_6c;
  int new_weight;
  int to_vertex;
  WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
  *edge;
  iterator __end0;
  iterator __begin0;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *__range2;
  vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  edges;
  Node *node;
  int weight;
  int vertex;
  SPElement *element_local;
  WeightedDigraph<int,_int> *graph_local;
  WeightedDigraphSPDijkstra<int,_int> *this_local;
  
  node._4_4_ = element->vertex;
  node._0_4_ = element->weight;
  _weight = element;
  element_local = (SPElement *)graph;
  graph_local = (WeightedDigraph<int,_int> *)this;
  edges.
  super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)data_structures::WeightedGraph<int,_int>::getNode
                          (&graph->super_WeightedGraph<int,_int>,(int *)((long)&node + 4));
  data_structures::WeightedGraphAdjSet<int,_int>::adjEdges
            ((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
              *)&__range2,
             &(((Node *)edges.
                        super__Vector_base<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->element).value);
  __end0 = std::
           vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
           ::begin((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                    *)&__range2);
  edge = (WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>
          *)std::
            vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            ::end((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                                *)&edge);
    if (!bVar1) {
      std::
      vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
      ::~vector((vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)&__range2);
      return;
    }
    _new_weight = __gnu_cxx::
                  __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
                  ::operator*(&__end0);
    local_6c = (_new_weight->to->element).key;
    local_70 = (int)node + _new_weight->weight;
    bVar1 = data_structures::SymbolTable<int,_int>::has(&this->_weight_to,&local_6c);
    if (bVar1) {
      iVar2 = data_structures::SymbolTable<int,_int>::get(&this->_weight_to,&local_6c);
      if (local_70 < iVar2) {
        data_structures::SymbolTable<int,_int>::set(&this->_weight_to,&local_6c,&local_70);
        data_structures::
        SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
        ::set(&this->_edge_to,&local_6c,_new_weight);
        i = data_structures::
            PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::size
                      (&this->_queue);
        for (local_98 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                        0x1; local_98 <= i;
            local_98 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                       ((long)&local_98->_vptr_ListNode + 1)) {
          data_structures::
          PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::minN
                    ((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                     (local_a8 + 8),(size_t)&this->_queue);
          if (local_a8._8_4_ == local_6c) {
            data_structures::
            PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::dequeueMinN
                      ((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>
                        *)local_a8,(size_t)&this->_queue);
            break;
          }
        }
        SPElement::SPElement(&local_b0,local_6c,&local_70);
        data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>
        ::enqueue(&this->_queue,&local_b0);
      }
    }
    else {
      data_structures::SymbolTable<int,_int>::set(&this->_weight_to,&local_6c,&local_70);
      data_structures::
      SymbolTable<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
      ::set(&this->_edge_to,&local_6c,_new_weight);
      SPElement::SPElement((SPElement *)((long)&size + 4),local_6c,&local_70);
      data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
      enqueue(&this->_queue,(SPElement *)((long)&size + 4));
    }
    __gnu_cxx::
    __normal_iterator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_*,_std::vector<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>,_std::allocator<data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void _relax(WeightedDigraph<T, Weight> &graph, const SPElement& element) {
            auto vertex = element.vertex;
            auto weight = element.weight;
            auto node = graph.getNode(vertex);
            auto edges = node->element.value.adjEdges();
            for (auto &edge: edges) {
                auto to_vertex = edge.to->element.key;
                auto new_weight = weight + edge.weight;
                if (!_weight_to.has(to_vertex)) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    _queue.enqueue(SPElement(to_vertex, new_weight));
                    continue;
                }
                if (_weight_to.get(to_vertex) > new_weight) {
                    _weight_to.set(to_vertex, new_weight);
                    _edge_to.set(to_vertex, edge);
                    // todo: create a new priority queue which supports method `change`
                    auto size = _queue.size();
                    for (size_t i = 1; i <= size; i++) {
                        if (_queue.minN(i).vertex == to_vertex) {
                            _queue.dequeueMinN(i);
                            break;
                        }
                    }
                    _queue.enqueue(SPElement(to_vertex, new_weight));
                }
            }
        }